

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O2

void __thiscall Refal2::CSetBuilder<char>::Reset(CSetBuilder<char> *this)

{
  this->fullSetStatus = S_Thru;
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::clear
            ((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> *)
             this);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::clear
            (&(this->no)._M_t);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::clear
            (&(this->thru)._M_t);
  return;
}

Assistant:

void CSetBuilder<T>::Reset()
{
	fullSetStatus = S_Thru;
	yes.clear();
	no.clear();
	thru.clear();
}